

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_post_process<ncnn::post_process_log<float>>(Mat *a,float coeff,Option *opt)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  uint extraout_EAX;
  uint uVar5;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  ulong extraout_RAX;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  float fVar12;
  
  uVar5 = a->dims;
  uVar10 = (ulong)uVar5;
  if (uVar5 == 3) {
    uVar2 = a->c;
    uVar6 = a->h * a->w;
    if ((ulong)uVar2 == 1) {
      if (0 < (int)uVar6) {
        pvVar11 = a->data;
        uVar10 = 0;
        do {
          fVar12 = logf(*(float *)((long)pvVar11 + uVar10 * 4));
          *(float *)((long)pvVar11 + uVar10 * 4) = fVar12;
          uVar10 = uVar10 + 1;
          uVar5 = extraout_EAX_01;
        } while (uVar6 != uVar10);
      }
    }
    else if (0 < (int)uVar2) {
      pvVar11 = a->data;
      sVar3 = a->cstep;
      sVar4 = a->elemsize;
      uVar9 = 0;
      do {
        if (0 < (int)uVar6) {
          uVar7 = 0;
          do {
            fVar12 = logf(*(float *)((long)pvVar11 + uVar7 * 4));
            *(float *)((long)pvVar11 + uVar7 * 4) = fVar12;
            uVar7 = uVar7 + 1;
            uVar10 = extraout_RAX;
          } while (uVar6 != uVar7);
        }
        uVar5 = (uint)uVar10;
        uVar9 = uVar9 + 1;
        pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
      } while (uVar9 != uVar2);
    }
  }
  else if (uVar5 == 2) {
    uVar5 = a->h * a->w;
    if (0 < (int)uVar5) {
      pvVar11 = a->data;
      uVar10 = (ulong)uVar5;
      uVar9 = 0;
      do {
        fVar12 = logf(*(float *)((long)pvVar11 + uVar9 * 4));
        *(float *)((long)pvVar11 + uVar9 * 4) = fVar12;
        uVar9 = uVar9 + 1;
        uVar5 = extraout_EAX_00;
      } while (uVar10 != uVar9);
    }
  }
  else if ((uVar5 == 1) && (iVar1 = a->w, 0 < (long)iVar1)) {
    pvVar11 = a->data;
    lVar8 = 0;
    do {
      fVar12 = logf(*(float *)((long)pvVar11 + lVar8 * 4));
      *(float *)((long)pvVar11 + lVar8 * 4) = fVar12;
      lVar8 = lVar8 + 1;
      uVar5 = extraout_EAX;
    } while (iVar1 != lVar8);
  }
  return uVar5;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3)
    {
        int c = a.c;
        int size = a.w * a.h;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}